

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

ArrayXZ * __thiscall IMLE::getMultiplePredictionErrorReductionDerivative(IMLE *this)

{
  ArrayX *this_00;
  ArrayXZ *this_01;
  XZ *other;
  long *plVar1;
  double dVar2;
  int iVar3;
  pointer pFVar4;
  ulong uVar5;
  int j;
  long lVar6;
  long lVar7;
  double dVar8;
  Scal SVar9;
  ArrayX sumInvRjSqPsijGammaj;
  ArrayXZ sumInvRjSqPsijGammajZetaj;
  ArrayXZ sumInvRjSqPsijDelta_dGammaj;
  X invRjSqPsij;
  pointer local_150;
  double local_148;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_140;
  X *local_e8;
  XZ *local_e0;
  ArrayXZ *local_d8;
  ArrayX *local_d0;
  Mat *local_c8;
  Mat *local_c0;
  Z *local_b8;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b0;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_80;
  void *local_68;
  undefined8 uStack_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  if (this->hasPredErrorReductionDrvt == false) {
    if (this->hasPredJacobian == false) {
      getMultiplePredictionsJacobian(this);
    }
    this_00 = &this->predictionsErrorReduction;
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(this_00);
    this_01 = &this->predictionsErrorReductionJacobian;
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::clear(this_01);
    iVar3 = this->nSolFound;
    local_e8 = &this->zeroX;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)local_e8);
    local_d0 = this_00;
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::resize(this_00,(long)iVar3,(value_type *)&local_58);
    free(local_58.m_data);
    iVar3 = this->nSolFound;
    other = &this->zeroXZ;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)other);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(this_01,(long)iVar3,(value_type *)&local_48);
    free(local_48.m_data);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector(&local_80,(long)this->nSolFound,other,(allocator_type *)&local_140);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::vector(&local_b0,(long)this->nSolFound,local_e8,(allocator_type *)&local_140);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector(&local_98,(long)this->nSolFound,other,(allocator_type *)&local_140);
    local_148 = 0.0;
    lVar6 = 0x168;
    for (lVar7 = 0; uVar5 = (ulong)this->M, lVar7 < (long)uVar5; lVar7 = lVar7 + 1) {
      pFVar4 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start;
      SVar9 = LinearExpert::queryHafterZ
                        ((LinearExpert *)((long)pFVar4 + lVar6 + -0x168),
                         (X *)((long)&(pFVar4->super_LinearExpert).d + lVar6));
      local_148 = local_148 + SVar9;
      lVar6 = lVar6 + 0x308;
    }
    local_68 = (void *)0x0;
    uStack_60 = 0;
    local_b8 = &this->zQuery;
    local_c0 = &this->fInvRj;
    local_c8 = &this->zeta;
    lVar7 = 0;
    local_e0 = other;
    local_d8 = this_01;
    for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
      pFVar4 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start;
      FastLinearExpert::queryNewPredXVar
                ((FastLinearExpert *)((long)&(pFVar4->super_LinearExpert).d + lVar7),local_b8,
                 *(double *)((long)&(pFVar4->super_LinearExpert).h + lVar7) / local_148);
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data + local_140.m_lhs.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     .m_rows.m_value * lVar6;
      local_140.m_rhs.m_functor.m_other =
           *(double *)
            ((long)&(((this->experts).
                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      .
                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).p_z_T + lVar7)
           / (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data[lVar6];
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           local_c0;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = lVar6;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride =
           local_140.m_lhs.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
      local_140.m_rhs.m_rows.m_value =
           local_140.m_lhs.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_68,&local_140);
      pFVar4 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = (long)&(pFVar4->super_LinearExpert).dGamma + lVar7;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_ =
           (long)&(pFVar4->super_LinearExpert).dNewGamma + lVar7;
      local_150 = local_80.
                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)&local_68;
      Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_150,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_0>_>
                  *)&local_140);
      pFVar4 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)
           (*(double *)((long)&(pFVar4->super_LinearExpert).gamma + lVar7) -
           *(double *)((long)&(pFVar4->super_LinearExpert).newGamma + lVar7));
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_68,
                 (Scalar *)&local_140);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 (local_b0.
                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6]),
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_68);
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_ =
           (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = (long)((this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_data +
                      local_140.m_lhs.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      ._16_8_ * lVar6);
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = (long)local_c8;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 0;
      local_150 = local_98.
                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)&local_68;
      local_140.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = lVar6;
      local_140.m_rhs.m_rows.m_value =
           local_140.m_lhs.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           _16_8_;
      Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_150,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                  *)&local_140);
      uVar5 = (ulong)(uint)this->M;
      lVar7 = lVar7 + 0x308;
    }
    lVar7 = 0;
    lVar6 = 0;
    for (dVar8 = 0.0; (long)dVar8 < (long)this->nSolFound; dVar8 = (double)((long)dVar8 + 1)) {
      dVar2 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[(long)dVar8];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows
        .m_value = (long)&(((this->predictionsVar).
                            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data + lVar6;
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             (XprTypeNested)
             ((long)&((local_b0.
                       super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + lVar6);
        local_150 = (pointer)((long)&(((this->predictionsErrorReduction).
                                       super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                                     .m_storage.m_data + lVar6);
        local_148 = dVar8;
        Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_150,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_140);
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value =
             (long)&(((this->predictionsVar).
                      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             + lVar6;
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_
             = *(long *)((long)&((local_b0.
                                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_rows + lVar6);
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride =
             (long)&((local_b0.
                      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             + lVar6;
        local_140.m_rhs.m_functor.m_other =
             (double)((long)&(((this->predictionsVarJacobian).
                               super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data + lVar7);
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startRow.m_value = 0x4000000000000000;
        local_150 = (pointer)((long)&(((this->predictionsErrorReductionJacobian).
                                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + lVar7);
        Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_150,
                   (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>
                    *)&local_140);
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows
        .m_value = (long)&(((this->predictionsVar).
                            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data + lVar6;
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             (XprTypeNested)
             ((long)&((local_80.
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data + lVar7);
        plVar1 = (long *)((long)&((local_98.
                                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_rows + lVar7);
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value = *plVar1;
        local_140.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride = plVar1[1];
        local_140.m_rhs._8_8_ =
             (long)&((local_98.
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_data + lVar7;
        local_140.m_rhs.m_rows.m_value = 0x4000000000000000;
        local_150 = (pointer)((long)&(((this->predictionsErrorReductionJacobian).
                                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + lVar7);
        Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)&local_150,
                   (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_1>_>
                    *)&local_140);
        dVar8 = local_148;
      }
      else {
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)
                   ((long)&(((local_d0->
                             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                           .m_data + lVar6),local_e8);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)
                   ((long)&(((local_d8->
                             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data + lVar7),local_e0);
      }
      lVar6 = lVar6 + 0x10;
      lVar7 = lVar7 + 0x18;
    }
    this->hasPredErrorReductionDrvt = true;
    free(local_68);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_98);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_b0);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_80);
  }
  return &this->predictionsErrorReductionJacobian;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionErrorReductionDerivative()
{
    if( !hasPredErrorReductionDrvt )
    {
        if( !hasPredJacobian )
            getMultiplePredictionsJacobian();

        predictionsErrorReduction.clear();
        predictionsErrorReductionJacobian.clear();
        predictionsErrorReduction.resize(nSolFound, zeroX);
        predictionsErrorReductionJacobian.resize(nSolFound, zeroXZ);

        ArrayXZ sumInvRjSqPsijDelta_dGammaj(nSolFound, zeroXZ);
        ArrayX sumInvRjSqPsijGammaj(nSolFound, zeroX);
        ArrayXZ sumInvRjSqPsijGammajZetaj(nSolFound, zeroXZ);

        Scal sumH = 0.0;
        for(int j = 0; j < M; j++)
            sumH += experts[j].queryHafterZ( experts[j].getPredX() );

        X invRjSqPsij;
        for(int j = 0; j < M; j++)
        {
            experts[j].queryNewPredXVar( zQuery, experts[j].get_h() / sumH );

            invRjSqPsij = fInvRj.col(j) * (experts[j].get_p_z() / varPhiAuxj(j));
            sumInvRjSqPsijDelta_dGammaj[sNearest[j]].noalias() += invRjSqPsij * ( experts[j].get_dGamma() - experts[j].get_dNewGamma() ).transpose();

            invRjSqPsij *= ( experts[j].getGamma() - experts[j].getNewGamma() ); //Using the same variable just to save resources...
            sumInvRjSqPsijGammaj[sNearest[j]] += invRjSqPsij;
            sumInvRjSqPsijGammajZetaj[sNearest[j]].noalias() += invRjSqPsij * zeta.col(j).transpose();
        }

       for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsErrorReduction[k] = zeroX;
                predictionsErrorReductionJacobian[k] = zeroXZ;
            }
            else
            {
                predictionsErrorReduction[k].noalias() = (predictionsVar[k].cwiseAbs2()).cwiseProduct(sumInvRjSqPsijGammaj[k]);
                predictionsErrorReductionJacobian[k].noalias() = (2.0*predictionsVar[k].cwiseProduct(sumInvRjSqPsijGammaj[k])).asDiagonal() * predictionsVarJacobian[k];
                predictionsErrorReductionJacobian[k].noalias() += predictionsVar[k].cwiseAbs2().asDiagonal() * (sumInvRjSqPsijDelta_dGammaj[k] - 2.0*sumInvRjSqPsijGammajZetaj[k]);
            }

        hasPredErrorReductionDrvt = true;
    }

    return predictionsErrorReductionJacobian;
}